

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaImpl::AddCleanupFallback
          (ArenaImpl *this,void *elem,_func_void_void_ptr *cleanup)

{
  _func_void_void_ptr *in_RSI;
  void *in_RDI;
  
  GetSerialArena((ArenaImpl *)cleanup);
  SerialArena::AddCleanup((SerialArena *)cleanup,in_RDI,in_RSI);
  return;
}

Assistant:

PROTOBUF_NOINLINE
void ArenaImpl::AddCleanupFallback(void* elem, void (*cleanup)(void*)) {
  GetSerialArena()->AddCleanup(elem, cleanup);
}